

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

void run_timer_loop_once(void)

{
  int iVar1;
  uint uVar2;
  uint child_pid;
  __pid_t child_pid_00;
  uv_loop_t *loop;
  ssize_t sVar3;
  uv_loop_t *loop_00;
  uint extraout_EDX;
  uint uVar4;
  uv_poll_t *puVar5;
  undefined1 *__buf;
  uv_loop_t *puVar6;
  char *loop_01;
  uv_timer_t timer_handle;
  undefined1 uStack_259;
  int iStack_258;
  uint uStack_254;
  undefined1 auStack_250 [8];
  undefined1 auStack_248 [176];
  uv_loop_t *puStack_198;
  uv_loop_t *puStack_190;
  int iStack_180;
  uint uStack_17c;
  undefined1 auStack_178 [180];
  uint uStack_c4;
  uv_loop_t *puStack_c0;
  
  loop = uv_default_loop();
  timer_cb_called = 0;
  puVar6 = loop;
  iVar1 = uv_timer_init(loop,(uv_timer_t *)&stack0xffffffffffffff60);
  if (iVar1 == 0) {
    puVar6 = (uv_loop_t *)&stack0xffffffffffffff60;
    iVar1 = uv_timer_start((uv_timer_t *)puVar6,timer_cb,1,0);
    if (iVar1 != 0) goto LAB_00154e2f;
    puVar6 = loop;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00154e34;
    if (timer_cb_called == 1) {
      return;
    }
  }
  else {
    run_timer_loop_once_cold_1();
LAB_00154e2f:
    run_timer_loop_once_cold_2();
LAB_00154e34:
    run_timer_loop_once_cold_3();
  }
  run_timer_loop_once_cold_4();
  loop_00 = (uv_loop_t *)((ulong)puVar6 & 0xffffffff);
  auStack_178._160_8_ = (__pthread_internal_list *)0x154e57;
  puStack_c0 = loop;
  uVar2 = waitpid((uint)puVar6,(int *)&uStack_c4,0);
  auStack_178._160_8_ = (__pthread_internal_list *)0x154e6c;
  printf("Waited pid is %d with status %d\n",(ulong)uVar2,(ulong)uStack_c4);
  if (uVar2 == 0xffffffff) {
    auStack_178._160_8_ = (__pthread_internal_list *)0x154e99;
    perror("Failed to wait");
  }
  if (uVar2 == (uint)puVar6) {
    if ((uStack_c4 & 0x7f) != 0) goto LAB_00154ea0;
    if ((uStack_c4 & 0xff00) == 0) {
      return;
    }
  }
  else {
    auStack_178._160_8_ = (__pthread_internal_list *)0x154ea0;
    assert_wait_child_cold_1();
LAB_00154ea0:
    auStack_178._160_8_ = (__pthread_internal_list *)0x154ea5;
    assert_wait_child_cold_2();
  }
  auStack_178._160_8_ = run_test_fork_socketpair;
  assert_wait_child_cold_3();
  puStack_190 = (uv_loop_t *)0x154eb7;
  auStack_178._160_8_ = loop_00;
  run_timer_loop_once();
  puVar6 = (uv_loop_t *)0x1;
  uVar4 = 1;
  puStack_190 = (uv_loop_t *)0x154ecd;
  iVar1 = socketpair(1,1,0,&iStack_180);
  if (iVar1 == 0) {
    puStack_190 = (uv_loop_t *)0x154eda;
    puVar6 = uv_default_loop();
    puVar5 = (uv_poll_t *)auStack_178;
    puStack_190 = (uv_loop_t *)0x154eeb;
    iVar1 = uv_poll_init(puVar6,puVar5,iStack_180);
    uVar4 = (uint)puVar5;
    if (iVar1 != 0) goto LAB_00154fe2;
    puStack_190 = (uv_loop_t *)0x154ef8;
    child_pid = fork();
    if (child_pid != 0) {
      loop_00 = (uv_loop_t *)(ulong)child_pid;
      if (child_pid == 0xffffffff) goto LAB_00154fec;
      puVar6 = (uv_loop_t *)(ulong)uStack_17c;
      uVar4 = 0x1a18c0;
      puStack_190 = (uv_loop_t *)0x154f1e;
      sVar3 = send(uStack_17c,"hi\n",3,0);
      if (sVar3 == 3) {
        puStack_190 = (uv_loop_t *)0x154f2f;
        assert_wait_child(child_pid);
LAB_00154f99:
        puStack_190 = (uv_loop_t *)0x154f9e;
        loop_00 = uv_default_loop();
        puStack_190 = (uv_loop_t *)0x154fb2;
        uv_walk(loop_00,close_walk_cb,(void *)0x0);
        uVar4 = 0;
        puStack_190 = (uv_loop_t *)0x154fbc;
        uv_run(loop_00,UV_RUN_DEFAULT);
        puStack_190 = (uv_loop_t *)0x154fc1;
        puVar6 = uv_default_loop();
        puStack_190 = (uv_loop_t *)0x154fc9;
        iVar1 = uv_loop_close(puVar6);
        if (iVar1 == 0) {
          puStack_190 = (uv_loop_t *)0x154fd2;
          uv_library_shutdown();
          return;
        }
        goto LAB_00154fe7;
      }
      goto LAB_00154ff1;
    }
    puStack_190 = (uv_loop_t *)0x154f36;
    puVar6 = uv_default_loop();
    puStack_190 = (uv_loop_t *)0x154f3e;
    iVar1 = uv_loop_fork(puVar6);
    if (iVar1 != 0) goto LAB_00154ff6;
    if (socket_cb_called != 0) goto LAB_00154ffb;
    puVar6 = (uv_loop_t *)auStack_178;
    uVar4 = 1;
    puStack_190 = (uv_loop_t *)0x154f69;
    iVar1 = uv_poll_start((uv_poll_t *)puVar6,1,socket_cb);
    if (iVar1 != 0) goto LAB_00155000;
    puStack_190 = (uv_loop_t *)0x154f7d;
    puts("Going to run the loop in the child");
    puStack_190 = (uv_loop_t *)0x154f82;
    puVar6 = uv_default_loop();
    uVar4 = 0;
    puStack_190 = (uv_loop_t *)0x154f8c;
    iVar1 = uv_run(puVar6,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00155005;
    if (socket_cb_called == 1) goto LAB_00154f99;
  }
  else {
    puStack_190 = (uv_loop_t *)0x154fe2;
    run_test_fork_socketpair_cold_1();
LAB_00154fe2:
    puStack_190 = (uv_loop_t *)0x154fe7;
    run_test_fork_socketpair_cold_2();
LAB_00154fe7:
    puStack_190 = (uv_loop_t *)0x154fec;
    run_test_fork_socketpair_cold_10();
LAB_00154fec:
    puStack_190 = (uv_loop_t *)0x154ff1;
    run_test_fork_socketpair_cold_8();
LAB_00154ff1:
    puStack_190 = (uv_loop_t *)0x154ff6;
    run_test_fork_socketpair_cold_9();
LAB_00154ff6:
    puStack_190 = (uv_loop_t *)0x154ffb;
    run_test_fork_socketpair_cold_3();
LAB_00154ffb:
    puStack_190 = (uv_loop_t *)0x155000;
    run_test_fork_socketpair_cold_4();
LAB_00155000:
    puStack_190 = (uv_loop_t *)0x155005;
    run_test_fork_socketpair_cold_5();
LAB_00155005:
    puStack_190 = (uv_loop_t *)0x15500a;
    run_test_fork_socketpair_cold_6();
  }
  puStack_190 = (uv_loop_t *)socket_cb;
  run_test_fork_socketpair_cold_7();
  socket_cb_called = socket_cb_called + 1;
  puStack_198 = loop_00;
  puStack_190 = (uv_loop_t *)(ulong)uVar2;
  if (uVar4 == 0) {
    auStack_248._160_8_ = (__pthread_internal_list *)0x155031;
    uVar4 = extraout_EDX;
    printf("Socket cb got events %d\n");
    loop_00 = puVar6;
    if ((extraout_EDX & 1) == 0) goto LAB_0015507d;
    if (socket_cb_read_fd == 0) {
LAB_00155068:
      uv_close((uv_handle_t *)puVar6,(uv_close_cb)0x0);
      return;
    }
    uVar4 = 0x30f300;
    auStack_248._160_8_ = (__pthread_internal_list *)0x155058;
    sVar3 = read(socket_cb_read_fd,socket_cb_read_buf,(ulong)socket_cb_read_size * 3);
    if (sVar3 == (ulong)socket_cb_read_size * 3) goto LAB_00155068;
  }
  else {
    auStack_248._160_8_ = (__pthread_internal_list *)0x15507d;
    socket_cb_cold_1();
LAB_0015507d:
    auStack_248._160_8_ = (__pthread_internal_list *)0x155082;
    socket_cb_cold_3();
  }
  auStack_248._160_8_ = run_test_fork_socketpair_started;
  socket_cb_cold_2();
  loop_01 = auStack_250;
  auStack_248._160_8_ = loop_00;
  iVar1 = pipe((int *)loop_01);
  if (iVar1 == 0) {
    run_timer_loop_once();
    loop_01 = (char *)0x1;
    uVar4 = 1;
    iVar1 = socketpair(1,1,0,&iStack_258);
    if (iVar1 != 0) goto LAB_001552e8;
    loop_01 = (char *)uv_default_loop();
    puVar5 = (uv_poll_t *)auStack_248;
    iVar1 = uv_poll_init((uv_loop_t *)loop_01,puVar5,iStack_258);
    uVar4 = (uint)puVar5;
    if (iVar1 != 0) goto LAB_001552ed;
    loop_01 = auStack_248;
    uVar4 = 1;
    iVar1 = uv_poll_start((uv_poll_t *)loop_01,1,socket_cb);
    if (iVar1 != 0) goto LAB_001552f2;
    loop_01 = (char *)uv_default_loop();
    uVar4 = 2;
    iVar1 = uv_run((uv_loop_t *)loop_01,UV_RUN_NOWAIT);
    if (iVar1 != 1) goto LAB_001552f7;
    child_pid_00 = fork();
    if (child_pid_00 != 0) {
      if (child_pid_00 == -1) goto LAB_00155301;
      loop_01 = auStack_248;
      iVar1 = uv_poll_stop((uv_poll_t *)loop_01);
      if (iVar1 != 0) goto LAB_00155306;
      uv_close((uv_handle_t *)auStack_248,(uv_close_cb)0x0);
      loop_01 = (char *)uv_default_loop();
      uVar4 = 0;
      iVar1 = uv_run((uv_loop_t *)loop_01,UV_RUN_DEFAULT);
      if (iVar1 != 0) goto LAB_00155310;
      if (socket_cb_called != 0) goto LAB_0015531a;
      loop_01 = (char *)(ulong)(uint)auStack_250._4_4_;
      uVar4 = 0x1a23e5;
      sVar3 = write(auStack_250._4_4_,"1",1);
      if (sVar3 != 1) goto LAB_00155324;
      loop_01 = (char *)(ulong)uStack_254;
      uVar4 = 0x1a18c0;
      sVar3 = send(uStack_254,"hi\n",3,0);
      if (sVar3 != 3) goto LAB_0015532e;
      loop_01 = (char *)uv_default_loop();
      uVar4 = 0;
      iVar1 = uv_run((uv_loop_t *)loop_01,UV_RUN_DEFAULT);
      if (iVar1 == 0) {
        if (socket_cb_called != 0) goto LAB_00155342;
        assert_wait_child(child_pid_00);
        goto LAB_0015529f;
      }
      goto LAB_00155338;
    }
    uVar2 = getpid();
    printf("Child is %d\n",(ulong)uVar2);
    loop_01 = (char *)(ulong)(uint)auStack_250._0_4_;
    __buf = &uStack_259;
    sVar3 = read(auStack_250._0_4_,__buf,1);
    uVar4 = (uint)__buf;
    if (sVar3 != 1) goto LAB_0015530b;
    loop_01 = (char *)uv_default_loop();
    iVar1 = uv_loop_fork((uv_loop_t *)loop_01);
    if (iVar1 != 0) goto LAB_00155315;
    if (socket_cb_called != 0) goto LAB_0015531f;
    puts("Going to run the loop in the child");
    socket_cb_read_fd = iStack_258;
    socket_cb_read_size = 1;
    loop_01 = (char *)uv_default_loop();
    uVar4 = 0;
    iVar1 = uv_run((uv_loop_t *)loop_01,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00155329;
    if (socket_cb_called != 1) goto LAB_00155333;
    loop_01 = "Buf %s\n";
    uVar4 = 0x30f300;
    printf("Buf %s\n");
    if (socket_cb_read_buf._0_4_ == 0xa6968) {
LAB_0015529f:
      puVar6 = uv_default_loop();
      uv_walk(puVar6,close_walk_cb,(void *)0x0);
      uVar4 = 0;
      uv_run(puVar6,UV_RUN_DEFAULT);
      loop_01 = (char *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop_01);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001552fc;
    }
  }
  else {
    run_test_fork_socketpair_started_cold_1();
LAB_001552e8:
    run_test_fork_socketpair_started_cold_2();
LAB_001552ed:
    run_test_fork_socketpair_started_cold_3();
LAB_001552f2:
    run_test_fork_socketpair_started_cold_4();
LAB_001552f7:
    run_test_fork_socketpair_started_cold_5();
LAB_001552fc:
    run_test_fork_socketpair_started_cold_20();
LAB_00155301:
    run_test_fork_socketpair_started_cold_12();
LAB_00155306:
    run_test_fork_socketpair_started_cold_13();
LAB_0015530b:
    run_test_fork_socketpair_started_cold_6();
LAB_00155310:
    run_test_fork_socketpair_started_cold_14();
LAB_00155315:
    run_test_fork_socketpair_started_cold_7();
LAB_0015531a:
    run_test_fork_socketpair_started_cold_15();
LAB_0015531f:
    run_test_fork_socketpair_started_cold_8();
LAB_00155324:
    run_test_fork_socketpair_started_cold_16();
LAB_00155329:
    run_test_fork_socketpair_started_cold_9();
LAB_0015532e:
    run_test_fork_socketpair_started_cold_17();
LAB_00155333:
    run_test_fork_socketpair_started_cold_10();
LAB_00155338:
    run_test_fork_socketpair_started_cold_18();
  }
  run_test_fork_socketpair_started_cold_11();
LAB_00155342:
  run_test_fork_socketpair_started_cold_19();
  fork_signal_cb_called = uVar4;
  uv_close((uv_handle_t *)loop_01,(uv_close_cb)0x0);
  return;
}

Assistant:

static void run_timer_loop_once(void) {
  uv_loop_t* loop;
  uv_timer_t timer_handle;

  loop = uv_default_loop();

  timer_cb_called = 0; /* Reset for the child. */

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);
}